

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fare_rule.c
# Opt level: O2

void read_fare_rule(fare_rule_t *record,int field_count,char **field_names,char **field_values)

{
  char *__s1;
  int iVar1;
  fare_rule_t *__dest;
  ulong uVar2;
  ulong uVar3;
  
  uVar2 = 0;
  record->fare_id[0] = '\0';
  record->route_id[0] = '\0';
  record->origin_id[0] = '\0';
  record->destination_id[0] = '\0';
  record->contains_id[0] = '\0';
  uVar3 = (ulong)(uint)field_count;
  if (field_count < 1) {
    uVar3 = uVar2;
  }
  do {
    if (uVar3 == uVar2) {
      return;
    }
    __s1 = field_names[uVar2];
    iVar1 = strcmp(__s1,"fare_id");
    __dest = record;
    if (iVar1 == 0) {
LAB_00104f05:
      strcpy(__dest->fare_id,field_values[uVar2]);
    }
    else {
      iVar1 = strcmp(__s1,"route_id");
      __dest = (fare_rule_t *)record->route_id;
      if (iVar1 == 0) goto LAB_00104f05;
      iVar1 = strcmp(__s1,"origin_id");
      __dest = (fare_rule_t *)record->origin_id;
      if (iVar1 == 0) goto LAB_00104f05;
      iVar1 = strcmp(__s1,"destination_id");
      __dest = (fare_rule_t *)record->destination_id;
      if (iVar1 == 0) goto LAB_00104f05;
      iVar1 = strcmp(__s1,"contains_id");
      __dest = (fare_rule_t *)record->contains_id;
      if (iVar1 == 0) goto LAB_00104f05;
    }
    uVar2 = uVar2 + 1;
  } while( true );
}

Assistant:

void read_fare_rule(fare_rule_t *record, int field_count, const char **field_names, const char **field_values) {
    init_fare_rule(record);

    for (int i = 0; i < field_count; i++) {
        if (strcmp(field_names[i], "fare_id") == 0) {
            strcpy(record->fare_id, field_values[i]);
            continue;
        }
        if (strcmp(field_names[i], "route_id") == 0) {
            strcpy(record->route_id, field_values[i]);
            continue;
        }
        if (strcmp(field_names[i], "origin_id") == 0) {
            strcpy(record->origin_id, field_values[i]);
            continue;
        }
        if (strcmp(field_names[i], "destination_id") == 0) {
            strcpy(record->destination_id, field_values[i]);
            continue;
        }
        if (strcmp(field_names[i], "contains_id") == 0) {
            strcpy(record->contains_id, field_values[i]);
            continue;
        }
    }
}